

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

uint __thiscall kj::_::BTreeImpl::Leaf::size(Leaf *this)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = 7;
  if (this->rows[6].i == 0) {
    iVar1 = 0;
  }
  iVar1 = iVar1 + (uint)(*(int *)((long)&this->rows[3].i + (ulong)(uint)(iVar1 * 4)) != 0) * 4;
  uVar2 = iVar1 + (uint)(*(int *)((long)&this->rows[1].i + (ulong)(uint)(iVar1 * 4)) != 0) * 2;
  return (uVar2 + 1) - (uint)(this->rows[uVar2].i == 0);
}

Assistant:

inline bool operator!=(decltype(nullptr)) const { return i != 0; }